

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void sha256_transform(uint32_t *state,uint32_t *data)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint *in_RSI;
  uint *in_RDI;
  uint32_t h;
  uint32_t g;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint j;
  uint32_t W [16];
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint *local_10;
  uint *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_58,0,0x40);
  local_60 = *local_8;
  local_64 = local_8[1];
  local_68 = local_8[2];
  local_6c = local_8[3];
  local_70 = local_8[4];
  local_74 = local_8[5];
  local_78 = local_8[6];
  local_7c = local_8[7];
  for (local_5c = 0; local_5c < 0x40; local_5c = local_5c + 0x10) {
    if (local_5c == 0) {
      local_58 = *local_10;
    }
    else {
      local_58 = ((local_20 << 0xf | local_20 >> 0x11) ^ (local_20 << 0xd | local_20 >> 0x13) ^
                 local_20 >> 10) + local_34 +
                 ((local_54 << 0x19 | local_54 >> 7) ^ (local_54 << 0xe | local_54 >> 0x12) ^
                 local_54 >> 3) + local_58;
    }
    iVar1 = ((local_70 << 0x1a | local_70 >> 6) ^ (local_70 << 0x15 | local_70 >> 0xb) ^
            (local_70 << 7 | local_70 >> 0x19)) + (local_78 ^ local_70 & (local_74 ^ local_78)) +
            K[local_5c] + local_58 + local_7c;
    local_6c = iVar1 + local_6c;
    uVar2 = ((local_60 << 0x1e | local_60 >> 2) ^ (local_60 << 0x13 | local_60 >> 0xd) ^
            (local_60 << 10 | local_60 >> 0x16)) +
            (local_60 & local_64 | local_68 & (local_60 | local_64)) + iVar1;
    if (local_5c == 0) {
      local_54 = local_10[1];
    }
    else {
      local_54 = ((local_1c << 0xf | local_1c >> 0x11) ^ (local_1c << 0xd | local_1c >> 0x13) ^
                 local_1c >> 10) + local_30 +
                 ((local_50 << 0x19 | local_50 >> 7) ^ (local_50 << 0xe | local_50 >> 0x12) ^
                 local_50 >> 3) + local_54;
    }
    iVar1 = ((local_6c * 0x4000000 | local_6c >> 6) ^ (local_6c * 0x200000 | local_6c >> 0xb) ^
            (local_6c * 0x80 | local_6c >> 0x19)) + (local_74 ^ local_6c & (local_70 ^ local_74)) +
            K[local_5c + 1] + local_54 + local_78;
    local_68 = iVar1 + local_68;
    uVar3 = ((uVar2 * 0x40000000 | uVar2 >> 2) ^ (uVar2 * 0x80000 | uVar2 >> 0xd) ^
            (uVar2 * 0x400 | uVar2 >> 0x16)) + (uVar2 & local_60 | local_64 & (uVar2 | local_60)) +
            iVar1;
    if (local_5c == 0) {
      local_50 = local_10[2];
    }
    else {
      local_50 = ((local_58 << 0xf | local_58 >> 0x11) ^ (local_58 << 0xd | local_58 >> 0x13) ^
                 local_58 >> 10) + local_2c +
                 ((local_4c << 0x19 | local_4c >> 7) ^ (local_4c << 0xe | local_4c >> 0x12) ^
                 local_4c >> 3) + local_50;
    }
    iVar1 = ((local_68 * 0x4000000 | local_68 >> 6) ^ (local_68 * 0x200000 | local_68 >> 0xb) ^
            (local_68 * 0x80 | local_68 >> 0x19)) + (local_70 ^ local_68 & (local_6c ^ local_70)) +
            K[local_5c + 2] + local_50 + local_74;
    local_64 = iVar1 + local_64;
    uVar4 = ((uVar3 * 0x40000000 | uVar3 >> 2) ^ (uVar3 * 0x80000 | uVar3 >> 0xd) ^
            (uVar3 * 0x400 | uVar3 >> 0x16)) + (uVar3 & uVar2 | local_60 & (uVar3 | uVar2)) + iVar1;
    if (local_5c == 0) {
      local_4c = local_10[3];
    }
    else {
      local_4c = ((local_54 << 0xf | local_54 >> 0x11) ^ (local_54 << 0xd | local_54 >> 0x13) ^
                 local_54 >> 10) + local_28 +
                 ((local_48 << 0x19 | local_48 >> 7) ^ (local_48 << 0xe | local_48 >> 0x12) ^
                 local_48 >> 3) + local_4c;
    }
    iVar1 = ((local_64 * 0x4000000 | local_64 >> 6) ^ (local_64 * 0x200000 | local_64 >> 0xb) ^
            (local_64 * 0x80 | local_64 >> 0x19)) + (local_6c ^ local_64 & (local_68 ^ local_6c)) +
            K[local_5c + 3] + local_4c + local_70;
    local_60 = iVar1 + local_60;
    uVar5 = ((uVar4 * 0x40000000 | uVar4 >> 2) ^ (uVar4 * 0x80000 | uVar4 >> 0xd) ^
            (uVar4 * 0x400 | uVar4 >> 0x16)) + (uVar4 & uVar3 | uVar2 & (uVar4 | uVar3)) + iVar1;
    if (local_5c == 0) {
      local_48 = local_10[4];
    }
    else {
      local_48 = ((local_50 << 0xf | local_50 >> 0x11) ^ (local_50 << 0xd | local_50 >> 0x13) ^
                 local_50 >> 10) + local_24 +
                 ((local_44 << 0x19 | local_44 >> 7) ^ (local_44 << 0xe | local_44 >> 0x12) ^
                 local_44 >> 3) + local_48;
    }
    iVar1 = ((local_60 * 0x4000000 | local_60 >> 6) ^ (local_60 * 0x200000 | local_60 >> 0xb) ^
            (local_60 * 0x80 | local_60 >> 0x19)) + (local_68 ^ local_60 & (local_64 ^ local_68)) +
            K[local_5c + 4] + local_48 + local_6c;
    uVar2 = iVar1 + uVar2;
    uVar6 = ((uVar5 * 0x40000000 | uVar5 >> 2) ^ (uVar5 * 0x80000 | uVar5 >> 0xd) ^
            (uVar5 * 0x400 | uVar5 >> 0x16)) + (uVar5 & uVar4 | uVar3 & (uVar5 | uVar4)) + iVar1;
    if (local_5c == 0) {
      local_44 = local_10[5];
    }
    else {
      local_44 = ((local_4c << 0xf | local_4c >> 0x11) ^ (local_4c << 0xd | local_4c >> 0x13) ^
                 local_4c >> 10) + local_20 +
                 ((local_40 << 0x19 | local_40 >> 7) ^ (local_40 << 0xe | local_40 >> 0x12) ^
                 local_40 >> 3) + local_44;
    }
    iVar1 = ((uVar2 * 0x4000000 | uVar2 >> 6) ^ (uVar2 * 0x200000 | uVar2 >> 0xb) ^
            (uVar2 * 0x80 | uVar2 >> 0x19)) + (local_64 ^ uVar2 & (local_60 ^ local_64)) +
            K[local_5c + 5] + local_44 + local_68;
    uVar3 = iVar1 + uVar3;
    uVar7 = ((uVar6 * 0x40000000 | uVar6 >> 2) ^ (uVar6 * 0x80000 | uVar6 >> 0xd) ^
            (uVar6 * 0x400 | uVar6 >> 0x16)) + (uVar6 & uVar5 | uVar4 & (uVar6 | uVar5)) + iVar1;
    if (local_5c == 0) {
      local_40 = local_10[6];
    }
    else {
      local_40 = ((local_48 << 0xf | local_48 >> 0x11) ^ (local_48 << 0xd | local_48 >> 0x13) ^
                 local_48 >> 10) + local_1c +
                 ((local_3c << 0x19 | local_3c >> 7) ^ (local_3c << 0xe | local_3c >> 0x12) ^
                 local_3c >> 3) + local_40;
    }
    iVar1 = ((uVar3 * 0x4000000 | uVar3 >> 6) ^ (uVar3 * 0x200000 | uVar3 >> 0xb) ^
            (uVar3 * 0x80 | uVar3 >> 0x19)) + (local_60 ^ uVar3 & (uVar2 ^ local_60)) +
            K[local_5c + 6] + local_40 + local_64;
    uVar4 = iVar1 + uVar4;
    uVar8 = ((uVar7 * 0x40000000 | uVar7 >> 2) ^ (uVar7 * 0x80000 | uVar7 >> 0xd) ^
            (uVar7 * 0x400 | uVar7 >> 0x16)) + (uVar7 & uVar6 | uVar5 & (uVar7 | uVar6)) + iVar1;
    if (local_5c == 0) {
      local_3c = local_10[7];
    }
    else {
      local_3c = ((local_44 << 0xf | local_44 >> 0x11) ^ (local_44 << 0xd | local_44 >> 0x13) ^
                 local_44 >> 10) + local_58 +
                 ((local_38 << 0x19 | local_38 >> 7) ^ (local_38 << 0xe | local_38 >> 0x12) ^
                 local_38 >> 3) + local_3c;
    }
    iVar1 = ((uVar4 * 0x4000000 | uVar4 >> 6) ^ (uVar4 * 0x200000 | uVar4 >> 0xb) ^
            (uVar4 * 0x80 | uVar4 >> 0x19)) + (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + K[local_5c + 7] +
            local_3c + local_60;
    uVar5 = iVar1 + uVar5;
    uVar9 = ((uVar8 * 0x40000000 | uVar8 >> 2) ^ (uVar8 * 0x80000 | uVar8 >> 0xd) ^
            (uVar8 * 0x400 | uVar8 >> 0x16)) + (uVar8 & uVar7 | uVar6 & (uVar8 | uVar7)) + iVar1;
    if (local_5c == 0) {
      local_38 = local_10[8];
    }
    else {
      local_38 = ((local_40 << 0xf | local_40 >> 0x11) ^ (local_40 << 0xd | local_40 >> 0x13) ^
                 local_40 >> 10) + local_54 +
                 ((local_34 << 0x19 | local_34 >> 7) ^ (local_34 << 0xe | local_34 >> 0x12) ^
                 local_34 >> 3) + local_38;
    }
    iVar1 = ((uVar5 * 0x4000000 | uVar5 >> 6) ^ (uVar5 * 0x200000 | uVar5 >> 0xb) ^
            (uVar5 * 0x80 | uVar5 >> 0x19)) + (uVar3 ^ uVar5 & (uVar4 ^ uVar3)) + K[local_5c + 8] +
            local_38 + uVar2;
    uVar6 = iVar1 + uVar6;
    local_7c = ((uVar9 * 0x40000000 | uVar9 >> 2) ^ (uVar9 * 0x80000 | uVar9 >> 0xd) ^
               (uVar9 * 0x400 | uVar9 >> 0x16)) + (uVar9 & uVar8 | uVar7 & (uVar9 | uVar8)) + iVar1;
    if (local_5c == 0) {
      local_34 = local_10[9];
    }
    else {
      local_34 = ((local_3c << 0xf | local_3c >> 0x11) ^ (local_3c << 0xd | local_3c >> 0x13) ^
                 local_3c >> 10) + local_50 +
                 ((local_30 << 0x19 | local_30 >> 7) ^ (local_30 << 0xe | local_30 >> 0x12) ^
                 local_30 >> 3) + local_34;
    }
    iVar1 = ((uVar6 * 0x4000000 | uVar6 >> 6) ^ (uVar6 * 0x200000 | uVar6 >> 0xb) ^
            (uVar6 * 0x80 | uVar6 >> 0x19)) + (uVar4 ^ uVar6 & (uVar5 ^ uVar4)) + K[local_5c + 9] +
            local_34 + uVar3;
    uVar7 = iVar1 + uVar7;
    local_78 = ((local_7c * 0x40000000 | local_7c >> 2) ^ (local_7c * 0x80000 | local_7c >> 0xd) ^
               (local_7c * 0x400 | local_7c >> 0x16)) +
               (local_7c & uVar9 | uVar8 & (local_7c | uVar9)) + iVar1;
    if (local_5c == 0) {
      local_30 = local_10[10];
    }
    else {
      local_30 = ((local_38 << 0xf | local_38 >> 0x11) ^ (local_38 << 0xd | local_38 >> 0x13) ^
                 local_38 >> 10) + local_4c +
                 ((local_2c << 0x19 | local_2c >> 7) ^ (local_2c << 0xe | local_2c >> 0x12) ^
                 local_2c >> 3) + local_30;
    }
    iVar1 = ((uVar7 * 0x4000000 | uVar7 >> 6) ^ (uVar7 * 0x200000 | uVar7 >> 0xb) ^
            (uVar7 * 0x80 | uVar7 >> 0x19)) + (uVar5 ^ uVar7 & (uVar6 ^ uVar5)) + K[local_5c + 10] +
            local_30 + uVar4;
    uVar8 = iVar1 + uVar8;
    local_74 = ((local_78 * 0x40000000 | local_78 >> 2) ^ (local_78 * 0x80000 | local_78 >> 0xd) ^
               (local_78 * 0x400 | local_78 >> 0x16)) +
               (local_78 & local_7c | uVar9 & (local_78 | local_7c)) + iVar1;
    if (local_5c == 0) {
      local_2c = local_10[0xb];
    }
    else {
      local_2c = ((local_34 << 0xf | local_34 >> 0x11) ^ (local_34 << 0xd | local_34 >> 0x13) ^
                 local_34 >> 10) + local_48 +
                 ((local_28 << 0x19 | local_28 >> 7) ^ (local_28 << 0xe | local_28 >> 0x12) ^
                 local_28 >> 3) + local_2c;
    }
    iVar1 = ((uVar8 * 0x4000000 | uVar8 >> 6) ^ (uVar8 * 0x200000 | uVar8 >> 0xb) ^
            (uVar8 * 0x80 | uVar8 >> 0x19)) + (uVar6 ^ uVar8 & (uVar7 ^ uVar6)) + K[local_5c + 0xb]
            + local_2c + uVar5;
    uVar9 = iVar1 + uVar9;
    local_70 = ((local_74 * 0x40000000 | local_74 >> 2) ^ (local_74 * 0x80000 | local_74 >> 0xd) ^
               (local_74 * 0x400 | local_74 >> 0x16)) +
               (local_74 & local_78 | local_7c & (local_74 | local_78)) + iVar1;
    if (local_5c == 0) {
      local_28 = local_10[0xc];
    }
    else {
      local_28 = ((local_30 << 0xf | local_30 >> 0x11) ^ (local_30 << 0xd | local_30 >> 0x13) ^
                 local_30 >> 10) + local_44 +
                 ((local_24 << 0x19 | local_24 >> 7) ^ (local_24 << 0xe | local_24 >> 0x12) ^
                 local_24 >> 3) + local_28;
    }
    iVar1 = ((uVar9 * 0x4000000 | uVar9 >> 6) ^ (uVar9 * 0x200000 | uVar9 >> 0xb) ^
            (uVar9 * 0x80 | uVar9 >> 0x19)) + (uVar7 ^ uVar9 & (uVar8 ^ uVar7)) + K[local_5c + 0xc]
            + local_28 + uVar6;
    local_7c = iVar1 + local_7c;
    local_6c = ((local_70 * 0x40000000 | local_70 >> 2) ^ (local_70 * 0x80000 | local_70 >> 0xd) ^
               (local_70 * 0x400 | local_70 >> 0x16)) +
               (local_70 & local_74 | local_78 & (local_70 | local_74)) + iVar1;
    if (local_5c == 0) {
      local_24 = local_10[0xd];
    }
    else {
      local_24 = ((local_2c << 0xf | local_2c >> 0x11) ^ (local_2c << 0xd | local_2c >> 0x13) ^
                 local_2c >> 10) + local_40 +
                 ((local_20 << 0x19 | local_20 >> 7) ^ (local_20 << 0xe | local_20 >> 0x12) ^
                 local_20 >> 3) + local_24;
    }
    iVar1 = ((local_7c * 0x4000000 | local_7c >> 6) ^ (local_7c * 0x200000 | local_7c >> 0xb) ^
            (local_7c * 0x80 | local_7c >> 0x19)) + (uVar8 ^ local_7c & (uVar9 ^ uVar8)) +
            K[local_5c + 0xd] + local_24 + uVar7;
    local_78 = iVar1 + local_78;
    local_68 = ((local_6c * 0x40000000 | local_6c >> 2) ^ (local_6c * 0x80000 | local_6c >> 0xd) ^
               (local_6c * 0x400 | local_6c >> 0x16)) +
               (local_6c & local_70 | local_74 & (local_6c | local_70)) + iVar1;
    if (local_5c == 0) {
      local_20 = local_10[0xe];
    }
    else {
      local_20 = ((local_28 << 0xf | local_28 >> 0x11) ^ (local_28 << 0xd | local_28 >> 0x13) ^
                 local_28 >> 10) + local_3c +
                 ((local_1c << 0x19 | local_1c >> 7) ^ (local_1c << 0xe | local_1c >> 0x12) ^
                 local_1c >> 3) + local_20;
    }
    iVar1 = ((local_78 * 0x4000000 | local_78 >> 6) ^ (local_78 * 0x200000 | local_78 >> 0xb) ^
            (local_78 * 0x80 | local_78 >> 0x19)) + (uVar9 ^ local_78 & (local_7c ^ uVar9)) +
            K[local_5c + 0xe] + local_20 + uVar8;
    local_74 = iVar1 + local_74;
    local_64 = ((local_68 * 0x40000000 | local_68 >> 2) ^ (local_68 * 0x80000 | local_68 >> 0xd) ^
               (local_68 * 0x400 | local_68 >> 0x16)) +
               (local_68 & local_6c | local_70 & (local_68 | local_6c)) + iVar1;
    if (local_5c == 0) {
      local_1c = local_10[0xf];
    }
    else {
      local_1c = ((local_24 << 0xf | local_24 >> 0x11) ^ (local_24 << 0xd | local_24 >> 0x13) ^
                 local_24 >> 10) + local_38 +
                 ((local_58 << 0x19 | local_58 >> 7) ^ (local_58 << 0xe | local_58 >> 0x12) ^
                 local_58 >> 3) + local_1c;
    }
    iVar1 = ((local_74 * 0x4000000 | local_74 >> 6) ^ (local_74 * 0x200000 | local_74 >> 0xb) ^
            (local_74 * 0x80 | local_74 >> 0x19)) + (local_7c ^ local_74 & (local_78 ^ local_7c)) +
            K[local_5c + 0xf] + local_1c + uVar9;
    local_70 = iVar1 + local_70;
    local_60 = ((local_64 * 0x40000000 | local_64 >> 2) ^ (local_64 * 0x80000 | local_64 >> 0xd) ^
               (local_64 * 0x400 | local_64 >> 0x16)) +
               (local_64 & local_68 | local_6c & (local_64 | local_68)) + iVar1;
  }
  *local_8 = local_60 + *local_8;
  local_8[1] = local_64 + local_8[1];
  local_8[2] = local_68 + local_8[2];
  local_8[3] = local_6c + local_8[3];
  local_8[4] = local_70 + local_8[4];
  local_8[5] = local_74 + local_8[5];
  local_8[6] = local_78 + local_8[6];
  local_8[7] = local_7c + local_8[7];
  return;
}

Assistant:

static void
sha256_transform(uint32_t *state, const uint32_t *data)
{
  uint32_t W[16] = {0};
  unsigned j;
  #ifdef _SHA256_UNROLL2
  uint32_t a,b,c,d,e,f,g,h;
  a = state[0];
  b = state[1];
  c = state[2];
  d = state[3];
  e = state[4];
  f = state[5];
  g = state[6];
  h = state[7];
  #else
  uint32_t T[8];
  for (j = 0; j < 8; j++)
    T[j] = state[j];
  #endif

  for (j = 0; j < 64; j += 16)
  {
    #if defined(_SHA256_UNROLL) || defined(_SHA256_UNROLL2)
    RX_8(0); RX_8(8);
    #else
    unsigned i;
    for (i = 0; i < 16; i++) { R(i); }
    #endif
  }

  #ifdef _SHA256_UNROLL2
  state[0] += a;
  state[1] += b;
  state[2] += c;
  state[3] += d;
  state[4] += e;
  state[5] += f;
  state[6] += g;
  state[7] += h;
  #else
  for (j = 0; j < 8; j++)
    state[j] += T[j];
  #endif

  /* Wipe variables */
  /* memset(W, 0, sizeof(W)); */
  /* memset(T, 0, sizeof(T)); */
}